

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

bool __thiscall
dxil_spv::SPIRVModule::Impl::query_builtin_shader_input(Impl *this,Id id,BuiltIn *builtin)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false> local_30;
  const_iterator itr;
  BuiltIn *builtin_local;
  Impl *pIStack_18;
  Id id_local;
  Impl *this_local;
  
  itr.super__Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>)builtin;
  builtin_local._4_4_ = id;
  pIStack_18 = this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spv::BuiltIn,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>_>
       ::find(&this->id_to_builtin_input,(key_type *)((long)&builtin_local + 4));
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spv::BuiltIn,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>_>
       ::end(&this->id_to_builtin_input);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_spv::BuiltIn>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spv::BuiltIn>,_false,_false>
                         *)&local_30);
    *(BuiltIn *)
     itr.super__Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>._M_cur =
         pvVar2->second;
  }
  return bVar1;
}

Assistant:

bool SPIRVModule::Impl::query_builtin_shader_input(spv::Id id, spv::BuiltIn *builtin) const
{
	auto itr = id_to_builtin_input.find(id);
	if (itr != id_to_builtin_input.end())
	{
		*builtin = itr->second;
		return true;
	}
	else
		return false;
}